

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::ExtPrivkey::DerivePrivkeyData
          (KeyData *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  ByteData fingerprint;
  ExtPrivkey key;
  
  DerivePrivkey(&key,this,string_path);
  Privkey::GeneratePubkey((Pubkey *)&local_c0,&this->privkey_,true);
  Pubkey::GetFingerprint(&fingerprint,(Pubkey *)&local_c0,4);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  KeyData::KeyData(__return_storage_ptr__,&key,string_path,&fingerprint);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
  ~ExtPrivkey(&key);
  return __return_storage_ptr__;
}

Assistant:

KeyData ExtPrivkey::DerivePrivkeyData(const std::string& string_path) const {
  ExtPrivkey key = DerivePrivkey(string_path);
  auto fingerprint = privkey_.GeneratePubkey().GetFingerprint();
  return KeyData(key, string_path, fingerprint);
}